

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::CanonicalizePath_abi_cxx11_
          (string *__return_storage_ptr__,compiler *this,string_view path)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  char *pcVar2;
  char *in_R8;
  string_view separator;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  canonical_parts;
  string_view part;
  const_iterator __begin2;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_78;
  const_iterator __end2;
  
  pcVar2 = (char *)path._M_len;
  canonical_parts.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  canonical_parts.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  canonical_parts.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this != (compiler *)0x0) && (*pcVar2 == '/')) {
    __begin2.pos_ = 0;
    __begin2._8_8_ = (long)" \t" + 2;
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&canonical_parts,(basic_string_view<char,_std::char_traits<char>_> *)&__begin2);
  }
  local_78.delimiter_.c_ = '/';
  local_78.text_._M_len = (size_t)this;
  local_78.text_._M_str = pcVar2;
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::begin(&__begin2,&local_78);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::end(&__end2,&local_78);
  while ((__begin2.state_ != __end2.state_ || (__begin2.pos_ != __end2.pos_))) {
    part._M_len = __begin2.curr_._M_len;
    part._M_str = __begin2.curr_._M_str;
    __x._M_str = __begin2.curr_._M_str;
    __x._M_len = __begin2.curr_._M_len;
    __y._M_str = ".";
    __y._M_len = 1;
    bVar1 = std::operator==(__x,__y);
    if (!bVar1) {
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::push_back(&canonical_parts,&part);
    }
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++(&__begin2);
  }
  if ((this != (compiler *)0x0) && ((pcVar2 + -1)[(long)this] == '/')) {
    __begin2.pos_ = 0;
    __begin2._8_8_ = (long)" \t" + 2;
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&canonical_parts,(basic_string_view<char,_std::char_traits<char>_> *)&__begin2);
  }
  separator._M_str = in_R8;
  separator._M_len = (size_t)"/";
  absl::lts_20250127::strings_internal::
  JoinRange<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
            (__return_storage_ptr__,(strings_internal *)&canonical_parts,
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x1,separator);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&canonical_parts.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

static std::string CanonicalizePath(absl::string_view path) {
#ifdef _WIN32
  // The Win32 API accepts forward slashes as a path delimiter even though
  // backslashes are standard.  Let's avoid confusion and use only forward
  // slashes.
  std::string path_str;
  if (absl::StartsWith(path, "\\\\")) {
    // Avoid converting two leading backslashes.
    path_str = absl::StrCat("\\\\",
                            absl::StrReplaceAll(path.substr(2), {{"\\", "/"}}));
  } else {
    path_str = absl::StrReplaceAll(path, {{"\\", "/"}});
  }
  path = path_str;
#endif

  std::vector<absl::string_view> canonical_parts;
  if (!path.empty() && path.front() == '/') canonical_parts.push_back("");
  for (absl::string_view part : absl::StrSplit(path, '/', absl::SkipEmpty())) {
    if (part == ".") {
      // Ignore.
    } else {
      canonical_parts.push_back(part);
    }
  }
  if (!path.empty() && path.back() == '/') canonical_parts.push_back("");

  return absl::StrJoin(canonical_parts, "/");
}